

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::checkPersistCall(CheckerVisitor *this,CallExpr *call)

{
  Node *n;
  int iVar1;
  SQChar *__s2;
  Expr *pEVar2;
  Expr **ppEVar3;
  pair<std::__detail::_Node_iterator<const_char_*,_true,_true>,_bool> pVar4;
  SQChar *key;
  _func_int **local_20;
  
  if ((this->effectsOnly == false) && (__s2 = extractFunctionName(this,call), __s2 != (SQChar *)0x0)
     ) {
    iVar1 = strcmp("persist",__s2);
    if (iVar1 == 0) {
      if ((call->_args)._size < 2) {
        return;
      }
      ppEVar3 = (call->_args)._vals;
    }
    else {
      iVar1 = strcmp("mkWatched",__s2);
      if (iVar1 != 0) {
        return;
      }
      if ((call->_args)._size < 2) {
        return;
      }
      pEVar2 = maybeEval(this,*(call->_args)._vals,(int32_t *)&local_20,false);
      if ((pEVar2->super_Node)._op != TO_ID) {
        return;
      }
      iVar1 = strcmp("persist",(char *)pEVar2[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      if (iVar1 != 0) {
        return;
      }
      ppEVar3 = (call->_args)._vals + 1;
    }
    n = &(*ppEVar3)->super_Node;
    if (((n != (Node *)0x0) &&
        (pEVar2 = maybeEval(this,(Expr *)n,(int32_t *)&local_20,false),
        (pEVar2->super_Node)._op == TO_LITERAL)) && (*(int *)&(pEVar2->super_Node).field_0x1c == 0))
    {
      local_20 = pEVar2[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      pVar4 = std::
              _Hashtable<char_const*,char_const*,std::allocator<char_const*>,std::__detail::_Identity,SQCompilation::StringEqualer,SQCompilation::StringHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<char_const*&>
                        ((_Hashtable<char_const*,char_const*,std::allocator<char_const*>,std::__detail::_Identity,SQCompilation::StringEqualer,SQCompilation::StringHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&this->persistedKeys);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        report(this,n,0x81,local_20);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkPersistCall(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *calleeName = extractFunctionName(call);

  if (!calleeName)
    return;

  const auto &arguments = call->arguments();
  const Expr *keyExpr = nullptr;

  if (strcmp("persist", calleeName) == 0) {
    if (arguments.size() < 2)
      return;
    keyExpr = arguments[0];
  }
  else if (strcmp("mkWatched", calleeName) == 0) {
    if (arguments.size() < 2)
      return;

    const Expr *persistsFunc = maybeEval(arguments[0]);
    if (persistsFunc->op() != TO_ID || strcmp("persist", persistsFunc->asId()->id()) != 0)
      return;

    keyExpr = arguments[1];
  }

  if (!keyExpr)
    return;

  const Expr *evalKeyExpr = maybeEval(keyExpr);

  if (evalKeyExpr->op() != TO_LITERAL)
    return;

  const LiteralExpr *l = evalKeyExpr->asLiteral();

  if (l->kind() != LK_STRING)
    return;

  const SQChar *key = l->s();

  auto r = persistedKeys.emplace(key);

  if (!r.second) {
    report(keyExpr, DiagnosticsId::DI_DUPLICATE_PERSIST_ID, key);
  }
}